

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O2

void __thiscall SimpleLogger::doCompression(SimpleLogger *this,size_t file_num)

{
  __int_type _Var1;
  SimpleLogger *pSVar2;
  ulong file_num_00;
  string filename_tar;
  string filename;
  string cmd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  undefined1 local_d0 [32];
  string local_b0;
  undefined1 local_90 [32];
  string local_70;
  
  getLogFilePath_abi_cxx11_((string *)(local_d0 + 0x20),this,file_num);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                 "tar zcvf ",(string *)(local_d0 + 0x20));
  std::operator+(&local_f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                 ".tar.gz ");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                 &local_f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_d0 + 0x20));
  std::__cxx11::string::operator=((string *)(local_90 + 0x20),(string *)local_d0);
  std::__cxx11::string::~string((string *)local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  pSVar2 = (SimpleLogger *)local_90;
  std::__cxx11::string::~string((string *)pSVar2);
  execCmd(pSVar2,(string *)(local_90 + 0x20));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                 "rm -f ",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (local_d0 + 0x20));
  pSVar2 = (SimpleLogger *)local_d0;
  std::__cxx11::string::operator=((string *)(local_90 + 0x20),(string *)pSVar2);
  std::__cxx11::string::~string((string *)pSVar2);
  execCmd(pSVar2,(string *)(local_90 + 0x20));
  _Var1 = (this->maxLogFiles).super___atomic_base<unsigned_long>._M_i;
  if (_Var1 - 1 < file_num) {
    file_num_00 = this->minRevnum;
    while (file_num_00 <= file_num - _Var1) {
      getLogFilePath_abi_cxx11_((string *)local_d0,this,file_num_00);
      std::__cxx11::string::operator=((string *)(local_d0 + 0x20),(string *)local_d0);
      std::__cxx11::string::~string((string *)local_d0);
      getLogFilePath_abi_cxx11_(&local_f0,this,file_num_00);
      std::operator+((string *)local_d0,&local_f0,".tar.gz");
      std::__cxx11::string::~string((string *)&local_f0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xffffffffffffffb0,"rm -f ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_d0 + 0x20));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xffffffffffffffb0," ");
      std::operator+(&local_f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                     (string *)local_d0);
      std::__cxx11::string::operator=((string *)(local_90 + 0x20),(string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)local_90);
      pSVar2 = (SimpleLogger *)&stack0xffffffffffffffb0;
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
      execCmd(pSVar2,(string *)(local_90 + 0x20));
      file_num_00 = file_num_00 + 1;
      this->minRevnum = file_num_00;
      std::__cxx11::string::~string((string *)local_d0);
    }
  }
  LOCK();
  (this->numCompJobs).super___atomic_base<unsigned_int>._M_i =
       (this->numCompJobs).super___atomic_base<unsigned_int>._M_i - 1;
  UNLOCK();
  std::__cxx11::string::~string((string *)(local_90 + 0x20));
  std::__cxx11::string::~string((string *)(local_d0 + 0x20));
  return;
}

Assistant:

void SimpleLogger::doCompression(size_t file_num) {
#if defined(__linux__) || defined(__APPLE__)
    std::string filename = getLogFilePath(file_num);
    std::string cmd;
    cmd = "tar zcvf " + filename + ".tar.gz " + filename;
    execCmd(cmd);

    cmd = "rm -f " + filename;
    execCmd(cmd);

    size_t max_log_files = maxLogFiles.load();
    // Remove previous log files.
    if (max_log_files && file_num >= max_log_files) {
        for (size_t ii=minRevnum; ii<=file_num-max_log_files; ++ii) {
            filename = getLogFilePath(ii);
            std::string filename_tar = getLogFilePath(ii) + ".tar.gz";
            cmd = "rm -f " + filename + " " + filename_tar;
            execCmd(cmd);
            minRevnum = ii+1;
        }
    }
#endif

    numCompJobs.fetch_sub(1);
}